

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O2

void ngx_rbtree_insert_value
               (ngx_rbtree_node_t *temp,ngx_rbtree_node_t *node,ngx_rbtree_node_t *sentinel)

{
  ngx_rbtree_node_t *pnVar1;
  bool bVar2;
  
  do {
    pnVar1 = temp;
    bVar2 = pnVar1->key <= node->key;
    temp = (&pnVar1->left)[bVar2];
  } while ((&pnVar1->left)[bVar2] != sentinel);
  (&pnVar1->left)[bVar2] = node;
  node->parent = pnVar1;
  node->left = sentinel;
  node->right = sentinel;
  node->color = '\x01';
  return;
}

Assistant:

void
ngx_rbtree_insert_value(ngx_rbtree_node_t *temp, ngx_rbtree_node_t *node,
    ngx_rbtree_node_t *sentinel)
{
    ngx_rbtree_node_t  **p;

    for ( ;; ) {

        p = (node->key < temp->key) ? &temp->left : &temp->right;

        if (*p == sentinel) {
            break;
        }

        temp = *p;
    }

    *p = node;
    node->parent = temp;
    node->left = sentinel;
    node->right = sentinel;
    ngx_rbt_red(node);
}